

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::DecodePsbtInput::ConvertFromStruct
          (DecodePsbtInput *this,DecodePsbtInputStruct *data)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  pointer __x;
  
  std::__cxx11::string::_M_assign((string *)&this->non_witness_utxo_hex_);
  DecodeRawTransactionResponse::ConvertFromStruct(&this->non_witness_utxo_,&data->non_witness_utxo);
  (this->witness_utxo_).amount_ = (data->witness_utxo).amount;
  DecodePsbtLockingScript::ConvertFromStruct
            (&(this->witness_utxo_).script_pub_key_,&(data->witness_utxo).script_pub_key);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->witness_utxo_).ignore_items._M_t,&(data->witness_utxo).ignore_items._M_t);
  core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
  ConvertFromStruct(&this->partial_signatures_,&data->partial_signatures);
  std::__cxx11::string::_M_assign((string *)&this->sighash_);
  PsbtScriptData::ConvertFromStruct(&this->redeem_script_,&data->redeem_script);
  PsbtScriptData::ConvertFromStruct(&this->witness_script_,&data->witness_script);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertFromStruct
            (&this->bip32_derivs_,&data->bip32_derivs);
  DecodeUnlockingScript::ConvertFromStruct(&this->final_scriptsig_,&data->final_scriptsig);
  __x = (data->final_scriptwitness).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (data->final_scriptwitness).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->final_scriptwitness_).
                   super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,__x);
      __x = __x + 1;
    } while (__x != pbVar1);
  }
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
            (&this->unknown_,&data->unknown);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodePsbtInput::ConvertFromStruct(
    const DecodePsbtInputStruct& data) {
  non_witness_utxo_hex_ = data.non_witness_utxo_hex;
  non_witness_utxo_.ConvertFromStruct(data.non_witness_utxo);
  witness_utxo_.ConvertFromStruct(data.witness_utxo);
  partial_signatures_.ConvertFromStruct(data.partial_signatures);
  sighash_ = data.sighash;
  redeem_script_.ConvertFromStruct(data.redeem_script);
  witness_script_.ConvertFromStruct(data.witness_script);
  bip32_derivs_.ConvertFromStruct(data.bip32_derivs);
  final_scriptsig_.ConvertFromStruct(data.final_scriptsig);
  final_scriptwitness_.ConvertFromStruct(data.final_scriptwitness);
  unknown_.ConvertFromStruct(data.unknown);
  ignore_items = data.ignore_items;
}